

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O1

void test_bson_oid_init_with_threads(void)

{
  void *pvVar1;
  long lVar2;
  bson_context_t *contexts [4];
  pthread_t threads [4];
  pthread_t local_58 [4];
  pthread_t local_38 [4];
  
  lVar2 = 0;
  do {
    pvVar1 = (void *)bson_context_new(8);
    *(void **)((long)local_58 + lVar2) = pvVar1;
    pthread_create((pthread_t *)((long)local_38 + lVar2),(pthread_attr_t *)0x0,oid_worker,pvVar1);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  lVar2 = 0;
  do {
    pthread_join(local_38[lVar2],(void **)0x0);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  lVar2 = 0;
  do {
    bson_context_destroy(local_58[lVar2]);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pvVar1 = (void *)bson_context_new(1);
  lVar2 = 0;
  do {
    pthread_create((pthread_t *)((long)local_58 + lVar2),(pthread_attr_t *)0x0,oid_worker,pvVar1);
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  lVar2 = 0;
  do {
    pthread_join(local_58[lVar2],(void **)0x0);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  bson_context_destroy(pvVar1);
  return;
}

Assistant:

static void
test_bson_oid_init_with_threads (void)
{
   bson_context_t *context;
   int i;

   {
      bson_context_flags_t flags = BSON_CONTEXT_NONE;
      bson_context_t *contexts[N_THREADS];
      bson_thread_t threads[N_THREADS];

#ifdef BSON_HAVE_SYSCALL_TID
      flags |= BSON_CONTEXT_USE_TASK_ID;
#endif

      for (i = 0; i < N_THREADS; i++) {
         contexts[i] = bson_context_new (flags);
         bson_thread_create (&threads[i], oid_worker, contexts[i]);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_join (threads[i]);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_context_destroy (contexts[i]);
      }
   }

   /*
    * Test threaded generation of oids using a single context;
    */
   {
      bson_thread_t threads[N_THREADS];

      context = bson_context_new (BSON_CONTEXT_THREAD_SAFE);

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_create (&threads[i], oid_worker, context);
      }

      for (i = 0; i < N_THREADS; i++) {
         bson_thread_join (threads[i]);
      }

      bson_context_destroy (context);
   }
}